

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O1

vm_prop_id_t __thiscall CTcPrsNode::gen_code_propid(CTcPrsNode *this,int check_only,int is_expr)

{
  if (check_only == 0) {
    (**(this->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase)(this,0,0);
  }
  return 0;
}

Assistant:

vm_prop_id_t CTcPrsNode::gen_code_propid(int check_only, int is_expr)
{
    /* 
     *   simply evaluate the expression normally, anticipating that this
     *   will yield a property ID value at run-time 
     */
    if (!check_only)
        gen_code(FALSE, FALSE);

    /* tell the caller that there's no constant ID available */
    return VM_INVALID_PROP;
}